

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_swift_service_client
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  bool bVar1;
  t_service *ptVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  bVar1 = this->gen_cocoa_;
  poVar5 = t_generator::indent((t_generator *)this,out);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"open class ",0xb);
    iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_01,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Client",6);
    ptVar2 = tservice->extends_;
    std::__ostream_insert<char,std::char_traits<char>>(out," : ",3);
    if (ptVar2 == (t_service *)0x0) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"TClient","");
    }
    else {
      iVar4 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
      local_50 = local_40;
      lVar3 = *(long *)CONCAT44(extraout_var_02,iVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar3,((long *)CONCAT44(extraout_var_02,iVar4))[1] + lVar3);
      std::__cxx11::string::append((char *)&local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," /* , ",6);
    iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_03,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_03,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," */",3);
    block_open(this,out);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public class ",0xd);
    iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Client /* : ",0xc);
    iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," */",3);
    block_open(this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let __inProtocol : TProtocol",0x1c);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let __outProtocol : TProtocol",0x1d);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"public init(inoutProtocol: TProtocol)",0x25);
    block_open(this,out);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__inProtocol = inoutProtocol",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__outProtocol = inoutProtocol",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    block_close(this,out,true);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"public init(inProtocol: TProtocol, outProtocol: TProtocol)",0x3a);
    block_open(this,out);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__inProtocol = inProtocol",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__outProtocol = outProtocol",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    block_close(this,out,true);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client(ostream& out, t_service* tservice) {
  if (!gen_cocoa_) {
    indent(out) << "open class " << tservice->get_name() << "Client";// : "

    // Inherit from ParentClient
    t_service* parent = tservice->get_extends();
    out << " : " << ((parent == nullptr) ? "TClient" : parent->get_name() + "Client");
    out <<  " /* , " << tservice->get_name() << " */";
    block_open(out);
    out << endl;
  } else {
    // a
    indent(out) << "public class " << tservice->get_name() << "Client /* : " << tservice->get_name() << " */";
    block_open(out);
    out << endl;

    indent(out) << "let __inProtocol : TProtocol" << endl << endl;
    indent(out) << "let __outProtocol : TProtocol" << endl << endl;
    indent(out) << "public init(inoutProtocol: TProtocol)";
    block_open(out);

    indent(out) << "__inProtocol = inoutProtocol" << endl;
    indent(out) << "__outProtocol = inoutProtocol" << endl;
    block_close(out);
    out << endl;

    indent(out) << "public init(inProtocol: TProtocol, outProtocol: TProtocol)";
    block_open(out);
    indent(out) << "__inProtocol = inProtocol" << endl;
    indent(out) << "__outProtocol = outProtocol" << endl;
    block_close(out);
    out << endl;
  }

  block_close(out);
  out << endl;
}